

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.h
# Opt level: O3

void __thiscall WangLandauSampler::markov_step(WangLandauSampler *this)

{
  FixedDegreeProposer *this_00;
  double dVar1;
  double dVar2;
  uint uVar3;
  Network *network;
  Random *pRVar4;
  pointer pdVar5;
  Histogram<unsigned_int> *pHVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  GeneratedProposal proposal;
  GeneratedProposal local_50;
  
  network = (this->super_UniformSampler).network;
  uVar7 = network->total_triangles;
  this_00 = &(this->super_UniformSampler).proposer;
  FixedDegreeProposer::generate_proposal(&local_50,this_00,network);
  FixedDegreeProposer::propose(this_00,(this->super_UniformSampler).network,&local_50);
  pRVar4 = (this->super_UniformSampler).super_Sampler.rng;
  uVar3 = ((this->super_UniformSampler).network)->total_triangles;
  dVar8 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (&pRVar4->generator);
  dVar1 = (pRVar4->uniform)._M_param._M_a;
  dVar2 = (pRVar4->uniform)._M_param._M_b;
  pdVar5 = (this->entropy).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar9 = exp(pdVar5[(ulong)uVar7 / 3] - pdVar5[(ulong)uVar3 / 3]);
  if (dVar9 < (dVar2 - dVar1) * dVar8 + dVar1) {
    FixedDegreeProposer::rollback(this_00,(this->super_UniformSampler).network,&local_50);
  }
  pHVar6 = (this->super_UniformSampler).super_Sampler.histogram;
  (*pHVar6->_vptr_Histogram[3])
            (pHVar6,(ulong)((this->super_UniformSampler).network)->total_triangles / 3);
  dVar1 = this->f;
  uVar7 = Histogram<unsigned_int>::bin
                    ((this->super_UniformSampler).super_Sampler.histogram,
                     ((this->super_UniformSampler).network)->total_triangles / 3);
  pdVar5 = (this->entropy).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5[uVar7] = dVar1 + pdVar5[uVar7];
  return;
}

Assistant:

void markov_step() {
        unsigned int old_triangles = network.get_triangles();

        GeneratedProposal proposal = proposer.generate_proposal(network);
        proposer.propose(network, proposal);

        unsigned int new_triangles = network.get_triangles();

        bool was_accepted = true;
        // if rejected
        if (rng.R() > exp(entropy[old_triangles] - entropy[new_triangles])) {
            proposer.rollback(network, proposal);
            was_accepted = false;
        }

        histogram.add(network.get_triangles());
        entropy[histogram.bin(network.get_triangles())] += f;
    }